

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corona_loader.cpp
# Opt level: O2

void __thiscall
embree::CoronaLoader::CoronaLoader(CoronaLoader *this,FileName *fileName,AffineSpace3fa *space)

{
  _Rb_tree_header *p_Var1;
  Ref<embree::SceneGraph::Node> *child;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  int iVar7;
  undefined4 uVar8;
  GroupNode *this_00;
  TransformNode *this_01;
  runtime_error *this_02;
  ulong uVar9;
  Ref<embree::XML> xml;
  undefined1 local_90 [32];
  string local_70;
  string local_50;
  
  FileName::FileName(&this->path);
  p_Var1 = &(this->materialMap)._M_t._M_impl.super__Rb_tree_header;
  (this->materialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->materialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->materialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->materialMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->materialMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->textureMap)._M_t._M_impl.super__Rb_tree_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->textureMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->textureFileMap)._M_t._M_impl.super__Rb_tree_header;
  (this->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  child = &this->root;
  (this->textureFileMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->root).ptr = (Node *)0x0;
  FileName::path((FileName *)local_90,fileName);
  std::__cxx11::string::operator=((string *)this,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::string((string *)(local_90 + 0x20),"/.-",(allocator *)local_90);
  parseXML((embree *)&xml,fileName,(string *)(local_90 + 0x20),false);
  std::__cxx11::string::~string((string *)(local_90 + 0x20));
  bVar6 = std::operator==(&(xml.ptr)->name,"scene");
  if (!bVar6) {
    this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(&local_50,&(xml.ptr)->loc);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90,
                   &local_50,": invalid scene tag");
    std::runtime_error::runtime_error(this_02,(string *)local_90);
    __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (GroupNode *)::operator_new(0x80);
  SceneGraph::GroupNode::GroupNode(this_00,0);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  for (uVar9 = 0;
      uVar9 < (ulong)((long)((xml.ptr)->children).
                            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)((xml.ptr)->children).
                            super__Vector_base<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    loadNode((CoronaLoader *)local_90,(Ref<embree::XML> *)this);
    SceneGraph::GroupNode::add(this_00,(Ref<embree::SceneGraph::Node> *)local_90);
    if ((long *)local_90._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_90._0_8_ + 0x18))();
    }
  }
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (child->ptr != (Node *)0x0) {
    (*(child->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  child->ptr = (Node *)this_00;
  iVar7 = (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  auVar2._4_4_ = -(uint)((space->l).vx.field_0.m128[1] == 0.0);
  auVar2._0_4_ = -(uint)((space->l).vx.field_0.m128[0] == 1.0);
  auVar2._8_4_ = -(uint)((space->l).vx.field_0.m128[2] == 0.0);
  auVar2._12_4_ = -(uint)((space->l).vx.field_0.m128[3] == 0.0);
  uVar8 = movmskps(iVar7,auVar2);
  if ((~(byte)uVar8 & 7) == 0) {
    auVar3._4_4_ = -(uint)((space->l).vy.field_0.m128[1] == 1.0);
    auVar3._0_4_ = -(uint)((space->l).vy.field_0.m128[0] == 0.0);
    auVar3._8_4_ = -(uint)((space->l).vy.field_0.m128[2] == 0.0);
    auVar3._12_4_ = -(uint)((space->l).vy.field_0.m128[3] == 0.0);
    uVar8 = movmskps(CONCAT31((int3)((uint)uVar8 >> 8),~(byte)uVar8),auVar3);
    if ((~(byte)uVar8 & 7) == 0) {
      auVar4._4_4_ = -(uint)((space->l).vz.field_0.m128[1] == 0.0);
      auVar4._0_4_ = -(uint)((space->l).vz.field_0.m128[0] == 0.0);
      auVar4._8_4_ = -(uint)((space->l).vz.field_0.m128[2] == 1.0);
      auVar4._12_4_ = -(uint)((space->l).vz.field_0.m128[3] == 0.0);
      uVar8 = movmskps(CONCAT31((int3)((uint)uVar8 >> 8),~(byte)uVar8),auVar4);
      if ((~(byte)uVar8 & 7) == 0) {
        auVar5._4_4_ = -(uint)((space->p).field_0.m128[1] == 0.0);
        auVar5._0_4_ = -(uint)((space->p).field_0.m128[0] == 0.0);
        auVar5._8_4_ = -(uint)((space->p).field_0.m128[2] == 0.0);
        auVar5._12_4_ = -(uint)((space->p).field_0.m128[3] == 0.0);
        uVar8 = movmskps(CONCAT31((int3)((uint)uVar8 >> 8),~(byte)uVar8),auVar5);
        if ((~(byte)uVar8 & 7) == 0) goto LAB_001952d3;
      }
    }
  }
  this_01 = (TransformNode *)SceneGraph::TransformNode::operator_new(0xa0);
  SceneGraph::TransformNode::TransformNode(this_01,space,child);
  (*(this_01->super_Node).super_RefCount._vptr_RefCount[2])(this_01);
  if (child->ptr != (Node *)0x0) {
    (*(child->ptr->super_RefCount)._vptr_RefCount[3])();
  }
  child->ptr = (Node *)this_01;
LAB_001952d3:
  if (xml.ptr != (XML *)0x0) {
    (*((xml.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  return;
}

Assistant:

CoronaLoader::CoronaLoader(const FileName& fileName, const AffineSpace3fa& space)
  {
    path = fileName.path();
    Ref<XML> xml = parseXML(fileName,"/.-",false);
    if (xml->name == "scene") 
    {
      Ref<SceneGraph::GroupNode> group = new SceneGraph::GroupNode;
      for (size_t i=0; i<xml->children.size(); i++) { 
        group->add(loadNode(xml->children[i]));
      }
      root = group.cast<SceneGraph::Node>();
    }
    else 
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid scene tag");

    if (space == AffineSpace3fa(one)) 
      return;
    
    root = new SceneGraph::TransformNode(space,root);
  }